

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_rpc_create_reply(char *buf,int len,mg_rpc_request *req,char *result_fmt,...)

{
  char *s;
  uint uVar1;
  char in_AL;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint s_len;
  undefined8 in_R8;
  undefined8 in_R9;
  json_token *pjVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_108;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pjVar5 = &mg_rpc_create_reply::null_tok;
  if (req->id != (json_token *)0x0) {
    pjVar5 = req->id;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar2 = json_emit(buf,len,"{s:s,s:","jsonrpc","2.0",anon_var_dwarf_1bac + 0x27);
  s = buf + iVar2;
  s_len = len - iVar2;
  if (pjVar5->type == JSON_TYPE_STRING) {
    uVar3 = json_emit_quoted_str(s,s_len,pjVar5->ptr,pjVar5->len);
  }
  else {
    uVar3 = pjVar5->len;
    if ((0 < (int)s_len) && (0 < (int)uVar3)) {
      uVar1 = s_len;
      if (uVar3 < s_len) {
        uVar1 = uVar3;
      }
      memcpy(s,pjVar5->ptr,(ulong)uVar1);
      if (uVar3 < s_len) {
        s[uVar1] = '\0';
      }
    }
  }
  iVar2 = uVar3 + iVar2;
  iVar4 = json_emit(buf + iVar2,len - iVar2,",s:","result");
  iVar4 = iVar4 + iVar2;
  local_108.gp_offset = 0x20;
  local_108.fp_offset = 0x30;
  local_108.overflow_arg_area = &stack0x00000008;
  local_108.reg_save_area = local_e8;
  iVar2 = json_emit_va(buf + iVar4,len - iVar4,result_fmt,&local_108);
  iVar2 = iVar2 + iVar4;
  iVar4 = json_emit(buf + iVar2,len - iVar2,"}");
  return iVar4 + iVar2;
}

Assistant:

int mg_rpc_create_reply(char *buf, int len, const struct mg_rpc_request *req,
                        const char *result_fmt, ...) {
    static const struct json_token null_tok = {"null", 4, 0, JSON_TYPE_NULL};
    const struct json_token *id = req->id == NULL ? &null_tok : req->id;
    va_list ap;
    int n = 0;

    n += json_emit(buf + n, len - n, "{s:s,s:", "jsonrpc", "2.0", "id");
    if (id->type == JSON_TYPE_STRING) {
        n += json_emit_quoted_str(buf + n, len - n, id->ptr, id->len);
    } else {
        n += json_emit_unquoted_str(buf + n, len - n, id->ptr, id->len);
    }
    n += json_emit(buf + n, len - n, ",s:", "result");

    va_start(ap, result_fmt);
    n += json_emit_va(buf + n, len - n, result_fmt, ap);
    va_end(ap);

    n += json_emit(buf + n, len - n, "}");

    return n;
}